

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.h
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::CompareTypePointers::operator()
          (CompareTypePointers *this,Type *lhs,Type *rhs)

{
  int iVar1;
  _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
  local_40;
  
  if ((lhs != (Type *)0x0) && (rhs != (Type *)0x0)) {
    local_40._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_40._M_impl.super__Rb_tree_header._M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar1 = (*lhs->_vptr_Type[2])(lhs,rhs,&local_40);
    std::
    _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
    ::_M_erase(&local_40,(_Link_type)local_40._M_impl.super__Rb_tree_header._M_header._M_parent);
    return SUB41(iVar1,0);
  }
  __assert_fail("lhs && rhs",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.h"
                ,0x3a,
                "bool spvtools::opt::analysis::CompareTypePointers::operator()(const Type *, const Type *) const"
               );
}

Assistant:

bool operator()(const Type* lhs, const Type* rhs) const {
    assert(lhs && rhs);
    return lhs->IsSame(rhs);
  }